

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O1

void __thiscall Button::Button(Button *this,string *text)

{
  pointer pcVar1;
  
  *(undefined8 *)((long)&(this->super_Widget).x1 + 1) = 0;
  *(undefined8 *)((long)&(this->super_Widget).x2 + 1) = 0;
  (this->super_Widget).dialog = (Dialog *)0x0;
  (this->super_Widget).x1 = 0;
  (this->super_Widget).y1 = 0;
  (this->super_Widget).grid_x = 0;
  (this->super_Widget).grid_y = 0;
  (this->super_Widget).grid_w = 0;
  (this->super_Widget).grid_h = 0;
  (this->super_Widget)._vptr_Widget = (_func_int **)&PTR__Button_0010f818;
  (this->text)._M_dataplus._M_p = (pointer)&(this->text).field_2;
  pcVar1 = (text->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->text,pcVar1,pcVar1 + text->_M_string_length);
  this->pushed = false;
  return;
}

Assistant:

Button::Button(std::string text):
   text(text),
   pushed(false)
{
}